

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

char * curl_unescape(char *string,int length)

{
  CURLcode CVar1;
  char *str;
  size_t outputlen;
  char *local_10;
  size_t local_8;
  
  local_10 = (char *)0x0;
  if ((-1 < length) &&
     (CVar1 = Curl_urldecode(string,(ulong)(uint)length,&local_10,&local_8,REJECT_NADA),
     CVar1 != CURLE_OK)) {
    local_10 = (char *)0x0;
  }
  return local_10;
}

Assistant:

char *curl_unescape(const char *string, int length)
{
  return curl_easy_unescape(NULL, string, length, NULL);
}